

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::cleanBuffer(CaptureVertexSeparate *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  CaptureVertexSeparate *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     (*(Context **)(&this->field_0x78 + (long)this->_vptr_CaptureVertexSeparate[-3])
                     );
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_buffers != (GLuint *)0x0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))
              (this->m_max_transform_feedback_separate_attribs,this->m_buffers);
    if (this->m_buffers != (GLuint *)0x0) {
      operator_delete__(this->m_buffers);
    }
    this->m_buffers = (GLuint *)0x0;
  }
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexSeparate::cleanBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (DE_NULL != m_buffers)
	{
		gl.deleteBuffers(m_max_transform_feedback_separate_attribs, m_buffers);

		delete[] m_buffers;

		m_buffers = DE_NULL;
	}
}